

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O2

int dollarstring(char *input,char **end)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  
  bVar2 = *input;
  iVar4 = -1;
  if ((byte)(bVar2 - 0x30) < 10) {
    pbVar5 = (byte *)(input + 1);
    iVar3 = 0;
    do {
      iVar1 = iVar3 * 10 + -0x30 + (uint)bVar2;
      if (0x7f < iVar3) {
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      bVar2 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    } while ((byte)(bVar2 - 0x30) < 10);
    if (bVar2 == 0x24 && (iVar3 < 0x81 && iVar3 != 0)) {
      *end = (char *)pbVar5;
      iVar4 = iVar3 + -1;
    }
  }
  return iVar4;
}

Assistant:

static int dollarstring(char *input, char **end)
{
  if(ISDIGIT(*input)) {
    int number = 0;
    do {
      if(number < MAX_PARAMETERS) {
        number *= 10;
        number += *input - '0';
      }
      input++;
    } while(ISDIGIT(*input));

    if(number && (number <= MAX_PARAMETERS) && ('$' == *input)) {
      *end = ++input;
      return number - 1;
    }
  }
  return -1;
}